

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac,REF_DBL *m,REF_DBL *jac_m_jact)

{
  long lVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL full_jac_m_jact [9];
  REF_DBL jac_m [9];
  REF_DBL local_78;
  REF_DBL full [9];
  REF_DBL *jac_m_jact_local;
  REF_DBL *m_local;
  REF_DBL *jac_local;
  
  jac_local._4_4_ = ref_matrix_m_full(m,&local_78);
  if (jac_local._4_4_ == 0) {
    for (k = 0; k < 3; k = k + 1) {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        jac_m[(long)(k + ref_private_macro_code_rss * 3) + -1] = 0.0;
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          lVar1 = (long)(k + ref_private_macro_code_rss * 3);
          jac_m[lVar1 + -1] =
               jac[k + ref_private_macro_code_rss_1 * 3] *
               full[(long)(ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 3) + -1] +
               jac_m[lVar1 + -1];
        }
      }
    }
    for (k = 0; k < 3; k = k + 1) {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        (&j + (long)(k + ref_private_macro_code_rss * 3) * 2)[0] = 0;
        (&j + (long)(k + ref_private_macro_code_rss * 3) * 2)[1] = 0;
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          lVar1 = (long)(k + ref_private_macro_code_rss * 3);
          *(double *)(&j + lVar1 * 2) =
               jac_m[(long)(k + ref_private_macro_code_rss_1 * 3) + -1] *
               jac[ref_private_macro_code_rss + ref_private_macro_code_rss_1 * 3] +
               *(double *)(&j + lVar1 * 2);
        }
      }
    }
    jac_local._4_4_ = ref_matrix_full_m((REF_DBL *)&j,jac_m_jact);
    if (jac_local._4_4_ == 0) {
      jac_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x540,"ref_matrix_jac_m_jact",(ulong)jac_local._4_4_,"full");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x52c,
           "ref_matrix_jac_m_jact",(ulong)jac_local._4_4_,"full");
  }
  return jac_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac, REF_DBL *m,
                                         REF_DBL *jac_m_jact) {
  REF_DBL full[9];
  REF_DBL jac_m[9];
  REF_DBL full_jac_m_jact[9];
  REF_INT i, j, k;

  RSS(ref_matrix_m_full(m, full), "full");

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      jac_m[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        jac_m[i + 3 * j] += jac[i + 3 * k] * full[k + 3 * j];
      }
    }
  }

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      full_jac_m_jact[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        full_jac_m_jact[i + 3 * j] += jac_m[i + 3 * k] * jac[j + 3 * k];
      }
    }
  }

  RSS(ref_matrix_full_m(full_jac_m_jact, jac_m_jact), "full");

  return REF_SUCCESS;
}